

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::LinTickIterator::InitFromRanges
          (LinTickIterator *this,float inParRange,float inOrthoScreenRange,float inDivGuess,
          TickInfo *ioTickInfo)

{
  int *piVar1;
  int local_44;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  float thePreferredNrOfTicks;
  float thePreferredSpan;
  TickInfo *ioTickInfo_local;
  float local_20;
  float inDivGuess_local;
  float inOrthoScreenRange_local;
  float inParRange_local;
  LinTickIterator *this_local;
  
  if (1e-20 < inDivGuess) {
    _thePreferredNrOfTicks = ioTickInfo;
    ioTickInfo_local._4_4_ = inDivGuess;
    local_20 = inOrthoScreenRange;
    inDivGuess_local = inParRange;
    _inOrthoScreenRange_local = this;
    local_34 = TickInfo::RoundSpan(inParRange / inDivGuess);
    if (0.0 <= local_34) {
      local_38 = inDivGuess_local / local_34;
      if (1.0 <= local_38) {
        _thePreferredNrOfTicks->mMajorTickSpan = local_34;
      }
      else {
        _thePreferredNrOfTicks->mMajorTickSpan = inDivGuess_local;
      }
      _thePreferredNrOfTicks->mTickDivision = 5;
      if ((_thePreferredNrOfTicks->mAutoTickSize & 1U) != 0) {
        local_3c = PPlot::Round(local_20 * 0.01);
        piVar1 = PMax<int>(&kMinMinorTickScreenSize,&local_3c);
        _thePreferredNrOfTicks->mMinorTickScreenSize = *piVar1;
        local_40 = _thePreferredNrOfTicks->mMinorTickScreenSize + 1;
        local_44 = PPlot::Round(local_20 * 0.02);
        piVar1 = PMax<int>(&local_40,&local_44);
        _thePreferredNrOfTicks->mMajorTickScreenSize = *piVar1;
      }
      TickInfo::MakeFormatString
                (_thePreferredNrOfTicks->mMajorTickSpan,&_thePreferredNrOfTicks->mFormatString);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LinTickIterator::InitFromRanges (float inParRange, float inOrthoScreenRange, float inDivGuess, TickInfo &ioTickInfo) const {
      if (inDivGuess <= kFloatSmall) {
        return false;
      }
      float thePreferredSpan = TickInfo::RoundSpan (inParRange/inDivGuess);
      if (thePreferredSpan < 0) {
        return false;
      }

      float thePreferredNrOfTicks = inParRange/thePreferredSpan;
      if (thePreferredNrOfTicks <1) {
        ioTickInfo.mMajorTickSpan = inParRange;
      }
      else {
        ioTickInfo.mMajorTickSpan = thePreferredSpan;
      }

      ioTickInfo.mTickDivision = 5;
      if (ioTickInfo.mAutoTickSize) {
          ioTickInfo.mMinorTickScreenSize = PMax (kMinMinorTickScreenSize, PPlot::Round (inOrthoScreenRange*kRelMinorTickSize));
          ioTickInfo.mMajorTickScreenSize = PMax (ioTickInfo.mMinorTickScreenSize+1, PPlot::Round (inOrthoScreenRange*kRelMajorTickSize));
      }

      TickInfo::MakeFormatString (ioTickInfo.mMajorTickSpan, ioTickInfo.mFormatString);
      return true;
    }